

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

TypeId __thiscall
Js::JavascriptNativeFloatArray::TrySetNativeFloatArrayItem
          (JavascriptNativeFloatArray *this,Var value,double *dValue)

{
  bool bVar1;
  int32 iVar2;
  double dVar3;
  
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt32(value);
    dVar3 = (double)iVar2;
  }
  else {
    if ((ulong)value >> 0x32 == 0) {
      ToVarArray(this);
      return TypeIds_Array;
    }
    dVar3 = JavascriptNumber::GetValue(value);
  }
  *dValue = dVar3;
  return TypeIds_ArrayLast;
}

Assistant:

TypeId JavascriptNativeFloatArray::TrySetNativeFloatArrayItem(Var value, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            *dValue = (double)TaggedInt::ToInt32(value);
            return TypeIds_NativeFloatArray;
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            *dValue = JavascriptNumber::GetValue(value);
            return TypeIds_NativeFloatArray;
        }

        JavascriptNativeFloatArray::ToVarArray(this);
        return TypeIds_Array;
    }